

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.c
# Opt level: O1

void DataTable_transfer(DataTable *to_data_table,DataTable *from_data_table)

{
  to_data_table->type = from_data_table->type;
  (to_data_table->location).line = (from_data_table->location).line;
  (to_data_table->location).column = (from_data_table->location).column;
  to_data_table->rows = from_data_table->rows;
  from_data_table->rows = (TableRows *)0x0;
  DataTable_delete(from_data_table);
  return;
}

Assistant:

void DataTable_transfer(DataTable* to_data_table, DataTable* from_data_table) {
    to_data_table->type = from_data_table->type;
    to_data_table->location.line = from_data_table->location.line;
    to_data_table->location.column = from_data_table->location.column;
    to_data_table->rows = from_data_table->rows;
    from_data_table->rows = 0;
    DataTable_delete(from_data_table);
}